

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

size_t confidential_commitment_varint_from_bytes(uchar *bytes,uint64_t *v,_Bool ct_value)

{
  uint uVar1;
  int iVar2;
  _Bool ct_value_local;
  uint64_t *v_local;
  uchar *bytes_local;
  
  uVar1 = (uint)*bytes;
  if (uVar1 == 1) {
    iVar2 = 0x21;
    if (ct_value) {
      iVar2 = 9;
    }
    *v = (long)iVar2;
    bytes_local = (uchar *)*v;
  }
  else if ((uVar1 - 2 < 2) || (uVar1 - 8 < 4)) {
    *v = 0x21;
    bytes_local = (uchar *)*v;
  }
  else {
    *v = 0;
    bytes_local = (uchar *)0x1;
  }
  return (size_t)bytes_local;
}

Assistant:

static size_t confidential_commitment_varint_from_bytes(const unsigned char *bytes,
                                                        uint64_t *v,
                                                        bool ct_value)
{
    switch (*bytes) {
    case 1:
        *v = ct_value ? WALLY_TX_ASSET_CT_VALUE_UNBLIND_LEN : WALLY_TX_ASSET_CT_LEN;
        return *v;
    case WALLY_TX_ASSET_CT_VALUE_PREFIX_A:
    case WALLY_TX_ASSET_CT_VALUE_PREFIX_B:
    case WALLY_TX_ASSET_CT_ASSET_PREFIX_A:
    case WALLY_TX_ASSET_CT_ASSET_PREFIX_B:
    case WALLY_TX_ASSET_CT_NONCE_PREFIX_A:
    case WALLY_TX_ASSET_CT_NONCE_PREFIX_B:
        *v = WALLY_TX_ASSET_CT_LEN;
        return *v;
    }
    *v = 0;
    return sizeof(uint8_t);
}